

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int attach_get_desired_capabilities(ATTACH_HANDLE attach,AMQP_VALUE *desired_capabilities_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  int iVar3;
  AMQP_VALUE pAVar4;
  bool bVar5;
  uint32_t item_count;
  char *desired_capabilities_single_value;
  uint local_34;
  char *local_30;
  
  if (attach == (ATTACH_HANDLE)0x0) {
    iVar3 = 0x13fd;
  }
  else {
    iVar1 = amqpvalue_get_composite_item_count(attach->composite_value,&local_34);
    iVar3 = 0x1405;
    if ((iVar1 == 0) && (iVar3 = 0x140b, 0xc < local_34)) {
      pAVar4 = amqpvalue_get_composite_item_in_place(attach->composite_value,0xc);
      iVar3 = 0x1413;
      if ((pAVar4 != (AMQP_VALUE)0x0) &&
         (AVar2 = amqpvalue_get_type(pAVar4), AVar2 != AMQP_TYPE_NULL)) {
        AVar2 = amqpvalue_get_type(pAVar4);
        if (AVar2 == AMQP_TYPE_ARRAY) {
          local_30 = (char *)0x0;
          bVar5 = true;
        }
        else {
          iVar3 = amqpvalue_get_symbol(pAVar4,&local_30);
          bVar5 = iVar3 != 0;
        }
        AVar2 = amqpvalue_get_type(pAVar4);
        if (AVar2 == AMQP_TYPE_ARRAY) {
          iVar3 = amqpvalue_get_array(pAVar4,desired_capabilities_value);
          if ((bool)(iVar3 != 0 & bVar5)) {
            return 0x1426;
          }
        }
        else if (bVar5) {
          return 0x1426;
        }
        AVar2 = amqpvalue_get_type(pAVar4);
        iVar3 = 0;
        if (AVar2 != AMQP_TYPE_ARRAY) {
          pAVar4 = amqpvalue_create_array();
          *desired_capabilities_value = pAVar4;
          if (pAVar4 == (AMQP_VALUE)0x0) {
            iVar3 = 0x142f;
          }
          else {
            pAVar4 = amqpvalue_create_symbol(local_30);
            if (pAVar4 == (AMQP_VALUE)0x0) {
              iVar3 = 0x1436;
            }
            else {
              iVar1 = amqpvalue_add_array_item(*desired_capabilities_value,pAVar4);
              iVar3 = 0x143c;
              if (iVar1 == 0) {
                iVar1 = amqpvalue_set_composite_item
                                  (attach->composite_value,0xc,*desired_capabilities_value);
                iVar3 = 0x1442;
                if (iVar1 == 0) {
                  iVar3 = 0;
                }
              }
              amqpvalue_destroy(pAVar4);
            }
            amqpvalue_destroy(*desired_capabilities_value);
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int attach_get_desired_capabilities(ATTACH_HANDLE attach, AMQP_VALUE* desired_capabilities_value)
{
    int result;

    if (attach == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)attach;
        if (amqpvalue_get_composite_item_count(attach_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 12)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(attach_instance->composite_value, 12);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    const char* desired_capabilities_single_value;
                    int get_single_value_result;
                    if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                    {
                        get_single_value_result = amqpvalue_get_symbol(item_value, &desired_capabilities_single_value);
                    }
                    else
                    {
                        (void)memset((void*)&desired_capabilities_single_value, 0, sizeof(desired_capabilities_single_value));
                        get_single_value_result = 1;
                    }

                    if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, desired_capabilities_value) != 0)) &&
                        (get_single_value_result != 0))
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                        {
                            *desired_capabilities_value = amqpvalue_create_array();
                            if (*desired_capabilities_value == NULL)
                            {
                                result = MU_FAILURE;
                            }
                            else
                            {
                                AMQP_VALUE single_amqp_value = amqpvalue_create_symbol(desired_capabilities_single_value);
                                if (single_amqp_value == NULL)
                                {
                                    result = MU_FAILURE;
                                }
                                else
                                {
                                    if (amqpvalue_add_array_item(*desired_capabilities_value, single_amqp_value) != 0)
                                    {
                                        result = MU_FAILURE;
                                    }
                                    else
                                    {
                                        if (amqpvalue_set_composite_item(attach_instance->composite_value, 12, *desired_capabilities_value) != 0)
                                        {
                                            result = MU_FAILURE;
                                        }
                                        else
                                        {
                                            result = 0;
                                        }
                                    }

                                    amqpvalue_destroy(single_amqp_value);
                                }
                                amqpvalue_destroy(*desired_capabilities_value);
                            }
                        }
                        else
                        {
                            result = 0;
                        }
                    }
                }
            }
        }
    }

    return result;
}